

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledRgbaInputFile::readTiles
          (TiledRgbaInputFile *this,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Lock *in_RDI;
  int in_R8D;
  int dx;
  int dy;
  Lock lock;
  int in_stack_000001a0;
  int in_stack_000001a4;
  int in_stack_000001a8;
  int in_stack_000001ac;
  FromYa *in_stack_000001b0;
  int in_stack_0000057c;
  int in_stack_00000580;
  int in_stack_00000584;
  int in_stack_00000588;
  int in_stack_0000058c;
  TiledInputFile *in_stack_00000590;
  int in_stack_000005a0;
  Mutex *in_stack_ffffffffffffffb8;
  Lock *in_stack_ffffffffffffffc0;
  int local_38;
  int local_34;
  
  if (in_RDI[1]._mutex == (Mutex *)0x0) {
    TiledInputFile::readTiles
              (in_stack_00000590,in_stack_0000058c,in_stack_00000588,in_stack_00000584,
               in_stack_00000580,in_stack_0000057c,in_stack_000005a0);
  }
  else {
    IlmThread_2_5::Lock::Lock
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,SUB81((ulong)in_RDI >> 0x38,0));
    for (local_34 = in_ECX; local_38 = in_ESI, local_34 <= in_R8D; local_34 = local_34 + 1) {
      for (; local_38 <= in_EDX; local_38 = local_38 + 1) {
        FromYa::readTile(in_stack_000001b0,in_stack_000001ac,in_stack_000001a8,in_stack_000001a4,
                         in_stack_000001a0);
      }
    }
    IlmThread_2_5::Lock::~Lock(in_RDI);
  }
  return;
}

Assistant:

void	
TiledRgbaInputFile::readTiles (int dxMin, int dxMax, int dyMin, int dyMax,
                               int lx, int ly)
{
    if (_fromYa)
    {
	Lock lock (*_fromYa);

        for (int dy = dyMin; dy <= dyMax; dy++)
            for (int dx = dxMin; dx <= dxMax; dx++)
	        _fromYa->readTile (dx, dy, lx, ly);
    }
    else
    {
        _inputFile->readTiles (dxMin, dxMax, dyMin, dyMax, lx, ly);
    }
}